

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_log_store.cxx
# Opt level: O1

ulong __thiscall cornerstone::fs_log_store::next_slot(fs_log_store *this)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->store_lock_);
  if (iVar3 == 0) {
    uVar1 = this->entries_in_store_;
    uVar2 = this->start_idx_;
    pthread_mutex_unlock((pthread_mutex_t *)&this->store_lock_);
    return uVar1 + uVar2;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

ulong fs_log_store::next_slot() const
{
    recur_lock(store_lock_);
    return start_idx_ + entries_in_store_;
}